

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

void __thiscall wasm::TypeBuilder::TypeBuilder(TypeBuilder *this,size_t n)

{
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> __ptr;
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> this_00;
  
  (this->impl)._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl = (Impl *)0x0;
  this_00._M_head_impl = (Impl *)operator_new(0xa8);
  Impl::Impl(this_00._M_head_impl,n);
  __ptr._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  (this->impl)._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl = this_00._M_head_impl;
  if (__ptr._M_head_impl != (Impl *)0x0) {
    std::default_delete<wasm::TypeBuilder::Impl>::operator()
              ((default_delete<wasm::TypeBuilder::Impl> *)this,__ptr._M_head_impl);
    return;
  }
  return;
}

Assistant:

TypeBuilder::TypeBuilder(size_t n) {
  impl = std::make_unique<TypeBuilder::Impl>(n);
}